

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

Offset<reflection::Field> __thiscall
flatbuffers::FieldDef::Serialize
          (FieldDef *this,FlatBufferBuilder *builder,uint16_t id,Parser *parser)

{
  uint16_t offset;
  Offset<flatbuffers::String> name;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  begin;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end;
  char *pcVar1;
  Offset<reflection::Type> type;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_> attributes;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> documentation
  ;
  Offset<reflection::Field> OVar2;
  int *piVar3;
  longlong default_integer;
  double dVar4;
  double default_real;
  char *endptr;
  
  FlatBufferBuilderImpl<false>::CreateStringImpl
            (builder,(this->super_Definition).name._M_dataplus._M_p,
             (this->super_Definition).name._M_string_length);
  name.o = (builder->buf_).size_;
  type = Type::Serialize(&(this->value).type,builder);
  attributes = SerializeAttributesCommon(&(this->super_Definition).attributes,builder,parser);
  documentation.o = 0;
  if ((parser->opts).binary_schema_comments == true) {
    begin._M_current =
         (this->super_Definition).doc_comment.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    end._M_current =
         (this->super_Definition).doc_comment.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (begin._M_current != end._M_current) {
      documentation =
           FlatBufferBuilderImpl<false>::
           CreateVectorOfStrings<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                     (builder,begin,end);
    }
  }
  pcVar1 = (this->value).constant._M_dataplus._M_p;
  if (pcVar1 == (char *)0x0) {
    __assert_fail("str && val",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/util.h"
                  ,0x138,"bool flatbuffers::StringToFloatImpl(T *, const char *const) [T = double]")
    ;
  }
  endptr = pcVar1;
  dVar4 = strtod_l(pcVar1,&endptr,ClassicLocale::instance_);
  default_real = 0.0;
  if (((endptr != pcVar1) && (*endptr == '\0')) && (default_real = dVar4, NAN(dVar4))) {
    default_real = NAN;
  }
  offset = (this->value).offset;
  if ((this->value).type.base_type - BASE_TYPE_UTYPE < 10) {
    pcVar1 = (this->value).constant._M_dataplus._M_p;
    if (pcVar1 == (char *)0x0) {
      __assert_fail("str",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/util.h"
                    ,0x11f,
                    "bool flatbuffers::StringToIntegerImpl(T *, const char *const, const int, const bool) [T = long]"
                   );
    }
    piVar3 = __errno_location();
    *piVar3 = 0;
    endptr = pcVar1;
    default_integer = strtoll_l(pcVar1,&endptr,10,ClassicLocale::instance_);
    if (((endptr == pcVar1) || (*endptr != '\0')) || (*piVar3 != 0)) {
      default_integer = 0;
    }
  }
  else {
    default_integer = 0;
  }
  if (1 < (this->value).type.base_type - BASE_TYPE_FLOAT) {
    default_real = 0.0;
  }
  OVar2 = reflection::CreateField
                    (builder,name,type,id,offset,default_integer,default_real,this->deprecated,
                     this->presence == kRequired,this->key,attributes,documentation,
                     this->presence == kOptional,(uint16_t)this->padding,this->offset64);
  return (Offset<reflection::Field>)OVar2.o;
}

Assistant:

Offset<reflection::Field> FieldDef::Serialize(FlatBufferBuilder *builder,
                                              uint16_t id,
                                              const Parser &parser) const {
  auto name__ = builder->CreateString(name);
  auto type__ = value.type.Serialize(builder);
  auto attr__ = SerializeAttributes(builder, parser);
  auto docs__ = parser.opts.binary_schema_comments && !doc_comment.empty()
                    ? builder->CreateVectorOfStrings(doc_comment)
                    : 0;
  double d;
  StringToNumber(value.constant.c_str(), &d);
  return reflection::CreateField(
      *builder, name__, type__, id, value.offset,
      // Is uint64>max(int64) tested?
      IsInteger(value.type.base_type) ? StringToInt(value.constant.c_str()) : 0,
      // result may be platform-dependent if underlying is float (not double)
      IsFloat(value.type.base_type) ? d : 0.0, deprecated, IsRequired(), key,
      attr__, docs__, IsOptional(), static_cast<uint16_t>(padding), offset64);
  // TODO: value.constant is almost always "0", we could save quite a bit of
  // space by sharing it. Same for common values of value.type.
}